

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O2

void m256v_U_invmult_inplace_p(m256v *LU,int rank,m256v *X_inout,int *placements)

{
  ulong uVar1;
  uint8_t alpha;
  ulong uVar2;
  ulong uVar3;
  int j;
  int r1;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = (ulong)rank;
  uVar4 = (ulong)(uint)rank;
  uVar5 = uVar2;
  while (uVar5 = uVar5 - 1, 0 < (long)uVar2) {
    uVar2 = uVar2 - 1;
    uVar3 = uVar2;
    if (placements != (int *)0x0) {
      uVar3 = (ulong)(uint)placements[uVar2];
    }
    uVar1 = uVar4 - 1;
    while( true ) {
      r1 = (int)uVar4;
      if (LU->n_col <= r1) break;
      if (placements != (int *)0x0) {
        r1 = placements[uVar4];
      }
      m256v_multadd_row(X_inout,r1,LU->e[uVar4 + LU->rstride * uVar5],X_inout,(int)uVar3);
      uVar4 = uVar4 + 1;
    }
    alpha = gf256_inv(LU->e[uVar2 + LU->rstride * uVar2]);
    m256v_mult_row(X_inout,(int)uVar3,alpha);
    uVar4 = uVar1;
  }
  return;
}

Assistant:

void MV_GEN_N(_U_invmult_inplace_p)(const MV_GEN_TYPE* LU,
				int rank,
				MV_GEN_TYPE* X_inout,
				const int* placements)
{
	/* Apply U^(-1) */
	for (int i = rank - 1; i >= 0; --i) {
		const int pi = (placements ? placements[i] : i);
		for (int j = i + 1; j < LU->n_col; ++j) {
			const int pj = (placements ? placements[j] : j);
			MV_GEN_N(_multadd_row)(X_inout, pj,
			  MV_GEN_N(_get_el)(LU, i, j),
			  X_inout, pi);
		}
		MV_GEN_N(_mult_row)(X_inout, pi,
				finv(MV_GEN_N(_get_el)(LU, i, i)));
	}
}